

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

int read_palette(store_palette_entry *palette,int *npalette,png_const_structp pp,png_infop pi)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  size_t __n;
  png_byte *ppVar4;
  int iVar5;
  char *pcVar6;
  store_palette_entry *__s;
  ulong uVar7;
  int num;
  png_bytep trans_alpha;
  png_colorp pal;
  uint local_3c;
  long local_38;
  long local_30;
  
  local_30 = 0;
  *npalette = -1;
  uVar2 = png_get_PLTE(pp,pi,&local_30,npalette);
  uVar1 = *npalette;
  uVar7 = (ulong)uVar1;
  if ((uVar2 & 8) == 0) {
    if (uVar1 != 0xffffffff) {
      pcVar6 = "validate: invalid PLTE result";
      goto LAB_0010dcef;
    }
    *npalette = 0;
    __n = 0x400;
    iVar5 = 0x71;
    __s = palette;
  }
  else {
    if (uVar1 - 0x101 < 0xffffff00) {
      pcVar6 = "validate: invalid PLTE count";
      goto LAB_0010dcef;
    }
    if (0 < (int)uVar1) {
      lVar3 = uVar7 + 1;
      ppVar4 = (png_byte *)(local_30 + uVar7 * 3 + -1);
      do {
        palette[lVar3 + -2].red = ppVar4[-2];
        palette[lVar3 + -2].green = ppVar4[-1];
        palette[lVar3 + -2].blue = *ppVar4;
        lVar3 = lVar3 + -1;
        ppVar4 = ppVar4 + -3;
      } while (1 < lVar3);
    }
    __s = palette + uVar7;
    __n = (long)(int)(0x100 - uVar1) << 2;
    iVar5 = 0x7e;
  }
  memset(__s,iVar5,__n);
  local_38 = 0;
  local_3c = 2;
  uVar7 = 0;
  uVar2 = png_get_tRNS(pp,pi,&local_38,&local_3c,0);
  if (((uVar2 & 0x10) == 0) || (local_3c == (local_38 == 0))) {
    iVar5 = *npalette;
    if (0 < (long)iVar5) {
      uVar7 = 0;
      do {
        palette[uVar7].alpha = 0xff;
        uVar7 = uVar7 + 1;
      } while ((long)iVar5 != uVar7);
    }
    if ((uint)uVar7 < 0x100) {
      uVar7 = uVar7 & 0xffffffff;
      do {
        palette[uVar7].alpha = '7';
        uVar7 = uVar7 + 1;
      } while (uVar7 != 0x100);
    }
    return 0;
  }
  if ((local_38 != 0) && (0xfffffeff < local_3c - 0x101)) {
    uVar1 = *npalette;
    if ((int)local_3c <= (int)uVar1) {
      uVar2 = 0;
      if (0 < (int)local_3c) {
        do {
          palette[uVar2].alpha = *(png_byte *)(local_38 + uVar2);
          uVar2 = uVar2 + 1;
        } while (local_3c != uVar2);
      }
      if ((int)uVar2 < (int)uVar1) {
        uVar2 = uVar2 & 0xffffffff;
        do {
          palette[uVar2].alpha = 0xff;
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
      }
      if (0xff < (uint)uVar2) {
        return 1;
      }
      uVar2 = uVar2 & 0xffffffff;
      do {
        uVar7 = uVar2 + 1;
        palette[uVar2].alpha = '!';
        uVar2 = uVar7;
      } while ((int)uVar7 != 0x100);
      return 1;
    }
  }
  pcVar6 = "validate: unexpected png_get_tRNS (palette) result";
LAB_0010dcef:
  png_error(pp,pcVar6);
}

Assistant:

static int
read_palette(store_palette palette, int *npalette, png_const_structp pp,
   png_infop pi)
{
   png_colorp pal;
   png_bytep trans_alpha;
   int num;

   pal = 0;
   *npalette = -1;

   if (png_get_PLTE(pp, pi, &pal, npalette) & PNG_INFO_PLTE)
   {
      int i = *npalette;

      if (i <= 0 || i > 256)
         png_error(pp, "validate: invalid PLTE count");

      while (--i >= 0)
      {
         palette[i].red = pal[i].red;
         palette[i].green = pal[i].green;
         palette[i].blue = pal[i].blue;
      }

      /* Mark the remainder of the entries with a flag value (other than
       * white/opaque which is the flag value stored above.)
       */
      memset(palette + *npalette, 126, (256-*npalette) * sizeof *palette);
   }

   else /* !png_get_PLTE */
   {
      if (*npalette != (-1))
         png_error(pp, "validate: invalid PLTE result");
      /* But there is no palette, so record this: */
      *npalette = 0;
      memset(palette, 113, sizeof (store_palette));
   }

   trans_alpha = 0;
   num = 2; /* force error below */
   if ((png_get_tRNS(pp, pi, &trans_alpha, &num, 0) & PNG_INFO_tRNS) != 0 &&
      (trans_alpha != NULL || num != 1/*returns 1 for a transparent color*/) &&
      /* Oops, if a palette tRNS gets expanded png_read_update_info (at least so
       * far as 1.5.4) does not remove the trans_alpha pointer, only num_trans,
       * so in the above call we get a success, we get a pointer (who knows what
       * to) and we get num_trans == 0:
       */
      !(trans_alpha != NULL && num == 0)) /* TODO: fix this in libpng. */
   {
      int i;

      /* Any of these are crash-worthy - given the implementation of
       * png_get_tRNS up to 1.5 an app won't crash if it just checks the
       * result above and fails to check that the variables it passed have
       * actually been filled in!  Note that if the app were to pass the
       * last, png_color_16p, variable too it couldn't rely on this.
       */
      if (trans_alpha == NULL || num <= 0 || num > 256 || num > *npalette)
         png_error(pp, "validate: unexpected png_get_tRNS (palette) result");

      for (i=0; i<num; ++i)
         palette[i].alpha = trans_alpha[i];

      for (num=*npalette; i<num; ++i)
         palette[i].alpha = 255;

      for (; i<256; ++i)
         palette[i].alpha = 33; /* flag value */

      return 1; /* transparency */
   }

   else
   {
      /* No palette transparency - just set the alpha channel to opaque. */
      int i;

      for (i=0, num=*npalette; i<num; ++i)
         palette[i].alpha = 255;

      for (; i<256; ++i)
         palette[i].alpha = 55; /* flag value */

      return 0; /* no transparency */
   }
}